

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DisjunctiveIntervalMap.h
# Opt level: O0

DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> * __thiscall
dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::intersection
          (DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *this,
          DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *rhs)

{
  Offset s;
  bool bVar1;
  pointer ppVar2;
  iterator __first1;
  iterator __last1;
  iterator iVar3;
  Offset *pOVar4;
  undefined8 in_RDX;
  DiscreteInterval<dg::Offset> *in_RSI;
  _Base_ptr in_RDI;
  insert_iterator<std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>
  iVar5;
  insert_iterator<std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>
  iVar6;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> vals;
  pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>
  *rhsit;
  const_iterator __end0;
  const_iterator __begin0;
  MappingT *__range3;
  const_iterator it;
  DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *tmp;
  iterator __i;
  Offset in_stack_ffffffffffffff10;
  Offset in_stack_ffffffffffffff20;
  Offset in_stack_ffffffffffffff28;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *this_00;
  _Iter in_stack_ffffffffffffff38;
  _Self local_50;
  reference local_48;
  _Self local_40;
  _Self local_38;
  undefined8 local_30;
  _Self local_28;
  undefined1 local_19;
  undefined8 local_18;
  
  local_19 = 0;
  __i._M_node = in_RDI;
  local_18 = in_RDX;
  DisjunctiveIntervalMap((DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *)0x193e65);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
       ::begin(in_RDI);
  local_30 = local_18;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
       ::begin(in_RDI);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
       ::end(in_RDI);
  do {
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) {
      return (DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *)__i._M_node;
    }
    local_48 = std::
               _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                            *)0x193edc);
    while( true ) {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                             *)0x193ef1);
      bVar1 = Offset::operator<(&(ppVar2->first).end,(Offset *)local_48);
      if (!bVar1) break;
      local_50._M_node =
           (_Base_ptr)
           std::
           map<dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
           ::end(in_RDI);
      bVar1 = std::operator==(&local_28,&local_50);
      if (bVar1) {
        return (DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *)__i._M_node;
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                  *)0x193f5f);
    bVar1 = DiscreteInterval<dg::Offset>::overlaps
                      ((DiscreteInterval<dg::Offset> *)in_stack_ffffffffffffff10.offset,in_RSI);
    if (bVar1) {
      std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
      ::set((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
             *)0x193f85);
      std::
      _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                    *)0x193f92);
      std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
      ::begin((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
               *)in_RDI);
      std::
      _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                    *)0x193fb0);
      std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
      ::end((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
             *)in_RDI);
      __first1 = std::
                 set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                 ::begin(in_RDI);
      __last1 = std::
                set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                ::end(in_RDI);
      iVar3 = std::
              set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
              ::begin(in_RDI);
      iVar5 = std::
              inserter<std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>
                        ((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                          *)in_RDI,__i);
      iVar6.iter._M_node = iVar3._M_node;
      iVar6.container =
           (set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
            *)in_stack_ffffffffffffff38._M_node;
      iVar6 = std::
              set_intersection<std::_Rb_tree_const_iterator<dg::dda::RWNode*>,std::_Rb_tree_const_iterator<dg::dda::RWNode*>,std::insert_iterator<std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>
                        ((_Rb_tree_const_iterator<dg::dda::RWNode_*>)__first1._M_node,
                         (_Rb_tree_const_iterator<dg::dda::RWNode_*>)__last1._M_node,
                         (_Base_ptr)iVar5.iter._M_node,(_Base_ptr)iVar5.container,iVar6);
      this_00 = iVar6.container;
      in_stack_ffffffffffffff38 = iVar6.iter._M_node;
      std::
      _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                    *)0x194055);
      pOVar4 = std::max<dg::Offset>((Offset *)in_RDI,(Offset *)0x194065);
      s.offset = pOVar4->offset;
      std::
      _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                    *)0x19407a);
      pOVar4 = std::min<dg::Offset>((Offset *)in_RDI,(Offset *)0x194092);
      in_stack_ffffffffffffff10.offset = pOVar4->offset;
      DiscreteInterval<dg::Offset>::DiscreteInterval
                ((DiscreteInterval<dg::Offset> *)&stack0xffffffffffffff20,s,
                 in_stack_ffffffffffffff10);
      DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>::
      add<std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>
                ((DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *)this_00,
                 (IntervalT *)in_stack_ffffffffffffff28.offset,
                 (set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                  *)in_stack_ffffffffffffff20.offset);
      std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
      ::~set((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
              *)0x1940d1);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                  *)__i._M_node);
  } while( true );
}

Assistant:

DisjunctiveIntervalMap
    intersection(const DisjunctiveIntervalMap &rhs) const {
        DisjunctiveIntervalMap tmp;
        // FIXME: this could be done more efficiently
        auto it = _mapping.begin();
        for (auto &rhsit : rhs._mapping) {
            while (it->first.end < rhsit.first.start) {
                if (it == _mapping.end()) {
                    return tmp;
                }
            }
            if (it->first.overlaps(rhsit.first)) {
                decltype(rhsit.second) vals;
                std::set_intersection(it->second.begin(), it->second.end(),
                                      rhsit.second.begin(), rhsit.second.end(),
                                      std::inserter(vals, vals.begin()));
                tmp.add(IntervalT{std::max(it->first.start, rhsit.first.start),
                                  std::min(it->first.end, rhsit.first.end)},
                        vals);
            }
        }
        return tmp;
    }